

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.h
# Opt level: O0

float * __thiscall FBX::Vector3::operator[](Vector3 *this,int index)

{
  runtime_error *this_00;
  int index_local;
  Vector3 *this_local;
  
  this_local = this;
  if (index != 0) {
    if (index == 1) {
      this_local = (Vector3 *)&this->y;
    }
    else {
      if (index != 2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Access out of bounds");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_local = (Vector3 *)&this->z;
    }
  }
  return &this_local->x;
}

Assistant:

float &operator[](int index) {
            if (index == 0)
                return x;
            else if (index == 1)
                return y;
            else if (index == 2)
                return z;
            else
                throw std::runtime_error("Access out of bounds");
        }